

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

void __thiscall
flow::CallInstr::CallInstr
          (CallInstr *this,IRBuiltinFunction *callee,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args,string *name)

{
  LiteralType ty;
  Value **ppVVar1;
  Signature *pSVar2;
  Value **v;
  Value **__args;
  pointer local_78;
  Value **ppVStack_70;
  Value **local_68;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_58;
  IRBuiltinFunction *local_38;
  
  pSVar2 = NativeCallback::signature(callee->native_);
  ty = pSVar2->returnType_;
  local_78 = (pointer)0x0;
  ppVStack_70 = (Value **)0x0;
  local_68 = (Value **)0x0;
  local_38 = callee;
  std::vector<flow::Value*,std::allocator<flow::Value*>>::emplace_back<flow::Value*>
            ((vector<flow::Value*,std::allocator<flow::Value*>> *)&local_78,(Value **)&local_38);
  ppVVar1 = (args->super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (__args = (args->super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>)._M_impl.
                super__Vector_impl_data._M_start; __args != ppVVar1; __args = __args + 1) {
    if (ppVStack_70 == local_68) {
      std::vector<flow::Value*,std::allocator<flow::Value*>>::_M_realloc_insert<flow::Value*const&>
                ((vector<flow::Value*,std::allocator<flow::Value*>> *)&local_78,
                 (iterator)ppVStack_70,__args);
    }
    else {
      *ppVStack_70 = *__args;
      ppVStack_70 = ppVStack_70 + 1;
    }
  }
  local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = local_78;
  local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVStack_70;
  local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  Instr::Instr(&this->super_Instr,ty,&local_58,name);
  if (local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_001b03b8;
  return;
}

Assistant:

CallInstr::CallInstr(IRBuiltinFunction* callee, const std::vector<Value*>& args,
                     const std::string& name)
    : Instr(callee->signature().returnType(), join(callee, args), name) {}